

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O0

ssize_t tester_mq_receive(mqd_t tester_mq,tester_mq_msg *msg,_Bool *err)

{
  long lVar1;
  char *__src;
  _Bool *__dest;
  mqd_t __mqdes;
  size_t __msg_len;
  undefined8 uStack_60;
  char *local_58 [2];
  ssize_t local_48;
  ssize_t request_ret;
  unsigned_long __vla_expr0;
  size_t local_30;
  size_t buffsize;
  _Bool *err_local;
  tester_mq_msg *msg_local;
  ssize_t sStack_10;
  mqd_t tester_mq_local;
  
  uStack_60 = 0x101b4f;
  buffsize = (size_t)err;
  err_local = &msg->completed;
  msg_local._4_4_ = tester_mq;
  __msg_len = tester_mq_get_buffsize(tester_mq,err);
  __mqdes = msg_local._4_4_;
  local_30 = __msg_len;
  if ((*(byte *)buffsize & 1) == 0) {
    lVar1 = -(__msg_len + 0xf & 0xfffffffffffffff0);
    local_58[0] = (char *)((long)local_58 + lVar1);
    request_ret = __msg_len;
    __vla_expr0 = (unsigned_long)local_58;
    *(undefined8 *)((long)local_58 + lVar1 + -8) = 0x101bcc;
    local_48 = mq_receive(__mqdes,(char *)((long)local_58 + lVar1),__msg_len,(uint *)0x0);
    __dest = err_local;
    __src = local_58[0];
    if (local_48 < 1) {
      if (buffsize != 0) {
        *(undefined1 *)buffsize = 1;
      }
      *(undefined8 *)((long)local_58 + lVar1 + -8) = 0x101c01;
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                    ,"tester_mq_receive");
      sStack_10 = -1;
    }
    else {
      *(undefined8 *)((long)local_58 + lVar1 + -8) = 0x101c28;
      memcpy(__dest,__src,0x400);
      sStack_10 = local_48;
    }
  }
  else {
    if (buffsize != 0) {
      *(undefined1 *)buffsize = 1;
    }
    uStack_60 = 0x101b86;
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                  ,"tester_mq_receive");
    sStack_10 = -1;
  }
  return sStack_10;
}

Assistant:

ssize_t tester_mq_receive(mqd_t tester_mq, tester_mq_msg *msg, bool *err) {
    assert(msg != NULL && err != NULL);

    size_t buffsize = tester_mq_get_buffsize(tester_mq, err);
    INT_FAIL_IF(*err);

    char buff[buffsize];
    ssize_t request_ret = mq_receive(tester_mq, buff, buffsize, NULL);
    INT_FAIL_IF(request_ret <= 0);

    memcpy(msg, buff, sizeof(tester_mq_msg));
    return request_ret;
}